

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setTolerances
          (SPxSolverBase<double> *this,shared_ptr<soplex::Tolerances> *newTolerances)

{
  UpdateVector<double> *in_RSI;
  shared_ptr<soplex::Tolerances> *in_RDI;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffd8;
  UpdateVector<double> *this_00;
  
  this_00 = in_RSI;
  std::shared_ptr<soplex::Tolerances>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  UpdateVector<double>::setTolerances(this_00,(shared_ptr<soplex::Tolerances> *)in_RSI);
  return;
}

Assistant:

virtual void setTolerances(std::shared_ptr<Tolerances> newTolerances)
   {
      this->_tolerances = newTolerances;
      // set tolerances for all the UpdateVectors
      this->primVec.setTolerances(newTolerances);
      this->dualVec.setTolerances(newTolerances);
      this->addVec.setTolerances(newTolerances);
      this->theFvec->setTolerances(newTolerances);
      this->theCoPvec->setTolerances(newTolerances);
      this->thePvec->setTolerances(newTolerances);
      this->theRPvec->setTolerances(newTolerances);
      this->theCPvec->setTolerances(newTolerances);
   }